

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::addToSystemMenu
          (QMdiSubWindowPrivate *this,WindowStateAction action,QString *text,char *slot)

{
  bool bVar1;
  QAction *ptr;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->systemMenu);
  if (bVar1) {
    ptr = QWidget::addAction((QWidget *)(this->systemMenu).wp.value,text,
                             *(QObject **)&(this->super_QWidgetPrivate).field_0x8,slot,
                             AutoConnection);
    QWeakPointer<QObject>::assign<QObject>(&this->actions[action].wp,(QObject *)ptr);
    return;
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::addToSystemMenu(WindowStateAction action, const QString &text,
                                           const char *slot)
{
    if (!systemMenu)
        return;
    actions[action] = systemMenu->addAction(text, q_func(), slot);
}